

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

uchar * xmlSerializeHexCharRef(uchar *out,int val)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar *local_20;
  uchar *ptr;
  int val_local;
  uchar *out_local;
  
  *out = '&';
  out[1] = '#';
  local_20 = out + 3;
  out[2] = 'x';
  if (0xf < val) {
    if (val < 0x100) {
      local_20 = out + 4;
    }
    else if (val < 0x1000) {
      local_20 = out + 5;
    }
    else if (val < 0x10000) {
      local_20 = out + 6;
    }
    else if (val < 0x100000) {
      local_20 = out + 7;
    }
    else {
      local_20 = out + 8;
    }
  }
  puVar1 = local_20;
  puVar2 = local_20 + 1;
  for (ptr._4_4_ = val; 0 < (int)ptr._4_4_; ptr._4_4_ = (int)ptr._4_4_ >> 4) {
    switch(ptr._4_4_ & 0xf) {
    case 0:
      *local_20 = '0';
      break;
    case 1:
      *local_20 = '1';
      break;
    case 2:
      *local_20 = '2';
      break;
    case 3:
      *local_20 = '3';
      break;
    case 4:
      *local_20 = '4';
      break;
    case 5:
      *local_20 = '5';
      break;
    case 6:
      *local_20 = '6';
      break;
    case 7:
      *local_20 = '7';
      break;
    case 8:
      *local_20 = '8';
      break;
    case 9:
      *local_20 = '9';
      break;
    case 10:
      *local_20 = 'A';
      break;
    case 0xb:
      *local_20 = 'B';
      break;
    case 0xc:
      *local_20 = 'C';
      break;
    case 0xd:
      *local_20 = 'D';
      break;
    case 0xe:
      *local_20 = 'E';
      break;
    case 0xf:
      *local_20 = 'F';
      break;
    default:
      *local_20 = '0';
    }
    local_20 = local_20 + -1;
  }
  *puVar2 = ';';
  puVar1[2] = '\0';
  return puVar1 + 2;
}

Assistant:

static unsigned char *
xmlSerializeHexCharRef(unsigned char *out, int val) {
    unsigned char *ptr;

    *out++ = '&';
    *out++ = '#';
    *out++ = 'x';
    if (val < 0x10) ptr = out;
    else if (val < 0x100) ptr = out + 1;
    else if (val < 0x1000) ptr = out + 2;
    else if (val < 0x10000) ptr = out + 3;
    else if (val < 0x100000) ptr = out + 4;
    else ptr = out + 5;
    out = ptr + 1;
    while (val > 0) {
	switch (val & 0xF) {
	    case 0: *ptr-- = '0'; break;
	    case 1: *ptr-- = '1'; break;
	    case 2: *ptr-- = '2'; break;
	    case 3: *ptr-- = '3'; break;
	    case 4: *ptr-- = '4'; break;
	    case 5: *ptr-- = '5'; break;
	    case 6: *ptr-- = '6'; break;
	    case 7: *ptr-- = '7'; break;
	    case 8: *ptr-- = '8'; break;
	    case 9: *ptr-- = '9'; break;
	    case 0xA: *ptr-- = 'A'; break;
	    case 0xB: *ptr-- = 'B'; break;
	    case 0xC: *ptr-- = 'C'; break;
	    case 0xD: *ptr-- = 'D'; break;
	    case 0xE: *ptr-- = 'E'; break;
	    case 0xF: *ptr-- = 'F'; break;
	    default: *ptr-- = '0'; break;
	}
	val >>= 4;
    }
    *out++ = ';';
    *out = 0;
    return(out);
}